

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
google::protobuf::compiler::cpp::MessageGenerator::RequiredFieldsBitMask
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          MessageGenerator *this)

{
  uint *puVar1;
  Descriptor *pDVar2;
  pointer piVar3;
  pointer puVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  long *plVar8;
  long lVar9;
  long *plVar10;
  long lVar11;
  int iVar12;
  allocator_type local_1d;
  value_type_conflict3 local_1c;
  
  uVar7 = this->max_has_bit_index_ + 0x1f;
  uVar5 = this->max_has_bit_index_ + 0x3e;
  if ((int)uVar7 < 0) {
    uVar7 = uVar5;
  }
  iVar6 = 4;
  if (0x3e < uVar5) {
    iVar6 = ((int)uVar7 >> 5) << 2;
  }
  local_1c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,(long)iVar6,&local_1c,&local_1d);
  pDVar2 = this->descriptor_;
  iVar6 = *(int *)(pDVar2 + 0x2c);
  if (0 < iVar6) {
    lVar9 = *(long *)(pDVar2 + 0x30);
    piVar3 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    plVar10 = (long *)(lVar9 + 0x68);
    lVar11 = 0;
    do {
      if (*(int *)((long)plVar10 + -0x1c) == 2) {
        if ((char)plVar10[-3] == '\0') {
          plVar8 = (long *)(plVar10[-2] + 0x30);
        }
        else if (*plVar10 == 0) {
          plVar8 = (long *)(plVar10[-7] + 0x98);
        }
        else {
          plVar8 = (long *)(*plVar10 + 0x80);
        }
        iVar6 = piVar3[(int)((ulong)(lVar9 - *plVar8) >> 3) * 0x3cf3cf3d];
        iVar12 = iVar6 + 0x1f;
        if (-1 < iVar6) {
          iVar12 = iVar6;
        }
        puVar1 = puVar4 + (iVar12 >> 5);
        *puVar1 = *puVar1 | 1 << ((byte)iVar6 & 0x1f);
        iVar6 = *(int *)(pDVar2 + 0x2c);
      }
      lVar11 = lVar11 + 1;
      plVar10 = plVar10 + 0x15;
      lVar9 = lVar9 + 0xa8;
    } while (lVar11 < iVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32> MessageGenerator::RequiredFieldsBitMask() const {
  const int array_size = HasBitsSize();
  std::vector<uint32> masks(array_size, 0);

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (!field->is_required()) {
      continue;
    }

    const int has_bit_index = has_bit_indices_[field->index()];
    masks[has_bit_index / 32] |=
        static_cast<uint32>(1) << (has_bit_index % 32);
  }
  return masks;
}